

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

void __thiscall
brotli::Hashers::WarmupHash<brotli::HashLongestMatch<14,5,4>>
          (Hashers *this,size_t size,uint8_t *dict,HashLongestMatch<14,_5,_4> *hasher)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  
  if (hasher->need_init_ == true) {
    memset(hasher,0,0x8000);
    hasher->need_init_ = false;
  }
  if (3 < size) {
    lVar2 = 0;
    do {
      uVar3 = (uint)(*(int *)(dict + lVar2) * 0x1e35a7bd) >> 0x12;
      uVar1 = hasher->num_[uVar3];
      *(int *)((long)hasher->buckets_[0] + (ulong)(uVar1 & 0x1f) * 4 + (ulong)(uVar3 << 7)) =
           (int)lVar2;
      hasher->num_[uVar3] = uVar1 + 1;
      lVar2 = lVar2 + 1;
    } while (size - 3 != lVar2);
  }
  return;
}

Assistant:

void WarmupHash(const size_t size, const uint8_t* dict, Hasher* hasher) {
    hasher->Init();
    for (size_t i = 0; i + Hasher::kHashTypeLength - 1 < size; i++) {
      hasher->Store(&dict[i], static_cast<uint32_t>(i));
    }
  }